

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O2

void place_object(obj *otmp,level *lev,int x,int y)

{
  obj **ppoVar1;
  int force;
  vptrs vVar2;
  
  vVar2 = (vptrs)((vptrs *)(lev->objects[x] + y))->v_ocarry;
  if ((int)otmp->where != 0) {
    panic("place_object: obj not free (%d,%d,%d)",(ulong)(uint)(int)otmp->where,
          (ulong)(uint)(int)otmp->otyp,(ulong)(uint)(int)otmp->invlet);
  }
  force = y;
  obj_no_longer_held(otmp);
  if (otmp->otyp == 0x214) {
    block_point(x,y);
  }
  ppoVar1 = lev->objects[x] + y;
  if ((vVar2 != (vptrs)0x0) && (*(short *)((long)vVar2 + 0x2a) == 0x214)) {
    ppoVar1 = (obj **)&(vVar2.v_ocarry)->data;
    vVar2 = (vVar2.v_nexthere)->v;
  }
  (otmp->v).v_ocarry = (monst *)vVar2;
  *ppoVar1 = otmp;
  otmp->ox = (xchar)x;
  otmp->oy = (xchar)y;
  otmp->where = '\x01';
  set_obj_level(lev,otmp);
  otmp->nobj = lev->objlist;
  lev->objlist = otmp;
  if (otmp->timed == '\0') {
    return;
  }
  obj_timer_checks(otmp,(xchar)x,(xchar)y,force);
  return;
}

Assistant:

void place_object(struct obj *otmp, struct level *lev, int x, int y)
{
    struct obj *otmp2 = lev->objects[x][y];

    if (otmp->where != OBJ_FREE) {
	panic("place_object: obj not free (%d,%d,%d)",
	      otmp->where, otmp->otyp, otmp->invlet);
    }

    obj_no_longer_held(otmp);
    if (otmp->otyp == BOULDER) block_point(x,y);	/* vision */

    /* obj goes under boulders */
    if (otmp2 && (otmp2->otyp == BOULDER)) {
	otmp->nexthere = otmp2->nexthere;
	otmp2->nexthere = otmp;
    } else {
	otmp->nexthere = otmp2;
	lev->objects[x][y] = otmp;
    }

    /* set the new object's location */
    otmp->ox = x;
    otmp->oy = y;

    otmp->where = OBJ_FLOOR;
    set_obj_level(lev, otmp); /* set the level recursively for containers */

    /* add to floor chain */
    otmp->nobj = lev->objlist;
    lev->objlist = otmp;
    if (otmp->timed) obj_timer_checks(otmp, x, y, 0);
}